

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_test.cc
# Opt level: O1

void leveldb::_Test_EntriesArePinned::_RunIt(void)

{
  _Test_EntriesArePinned t;
  CacheTest local_40;
  
  CacheTest::CacheTest(&local_40);
  _Run((_Test_EntriesArePinned *)&local_40);
  CacheTest::~CacheTest(&local_40);
  return;
}

Assistant:

TEST(CacheTest, EntriesArePinned) {
  Insert(100, 101);
  Cache::Handle* h1 = cache_->Lookup(EncodeKey(100));
  ASSERT_EQ(101, DecodeValue(cache_->Value(h1)));

  Insert(100, 102);
  Cache::Handle* h2 = cache_->Lookup(EncodeKey(100));
  ASSERT_EQ(102, DecodeValue(cache_->Value(h2)));
  ASSERT_EQ(0, deleted_keys_.size());

  cache_->Release(h1);
  ASSERT_EQ(1, deleted_keys_.size());
  ASSERT_EQ(100, deleted_keys_[0]);
  ASSERT_EQ(101, deleted_values_[0]);

  Erase(100);
  ASSERT_EQ(-1, Lookup(100));
  ASSERT_EQ(1, deleted_keys_.size());

  cache_->Release(h2);
  ASSERT_EQ(2, deleted_keys_.size());
  ASSERT_EQ(100, deleted_keys_[1]);
  ASSERT_EQ(102, deleted_values_[1]);
}